

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_application_info
          (Impl *this,StateCreatorInterface *iface,Value *app_info,Value *pdf_info)

{
  undefined8 uVar1;
  bool bVar2;
  SizeType SVar3;
  Number NVar4;
  VkApplicationInfo *info;
  Type pGVar5;
  Ch *pCVar6;
  char *pcVar7;
  undefined4 *__s;
  Hash HVar8;
  Hash HVar9;
  _func_int **pp_Var10;
  uint uVar11;
  ulong uVar12;
  undefined8 this_00;
  Data local_48;
  StateCreatorInterface *local_38;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_48.s,(Ch *)app_info);
  uVar1 = local_48.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(app_info);
  if (uVar1 != NVar4.i64) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_48.s,(Ch *)pdf_info);
    uVar1 = local_48.n;
    NVar4.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(pdf_info);
    if (uVar1 != NVar4.i64) {
      local_38 = iface;
      info = (VkApplicationInfo *)ScratchAllocator::allocate_raw(&this->allocator,0x30,0x10);
      if (info != (VkApplicationInfo *)0x0) {
        info->pEngineName = (char *)0x0;
        info->engineVersion = 0;
        info->apiVersion = 0;
        info->pApplicationName = (char *)0x0;
        *(undefined8 *)&info->applicationVersion = 0;
        *(undefined8 *)info = 0;
        info->pNext = (void *)0x0;
      }
      info->sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)app_info,"apiVersion");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_001458af:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      info->apiVersion = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)app_info,"applicationVersion");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001458af;
      info->applicationVersion = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)app_info,"engineVersion");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001458af;
      info->engineVersion = (pGVar5->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48.s,(Ch *)app_info);
      uVar1 = local_48.n;
      NVar4.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(app_info);
      local_48.o.members = (Member *)this;
      if (uVar1 != NVar4.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)app_info,"applicationName");
        SVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(pGVar5);
        uVar11 = SVar3 + 1;
        if (uVar11 == 0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = (char *)ScratchAllocator::allocate_raw(&this->allocator,(ulong)uVar11,0x10);
          if (pcVar7 != (char *)0x0) {
            memset(pcVar7,0,(ulong)uVar11);
          }
        }
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)app_info,"applicationName");
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar5);
        memcpy(pcVar7,pCVar6,(ulong)SVar3);
        info->pApplicationName = pcVar7;
      }
      this_00 = local_48.o.members;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48.s,(Ch *)app_info);
      uVar1 = local_48.n;
      NVar4.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(app_info);
      if (uVar1 != NVar4.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)app_info,"engineName");
        SVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(pGVar5);
        uVar11 = SVar3 + 1;
        if (uVar11 == 0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = (char *)ScratchAllocator::allocate_raw
                                     ((ScratchAllocator *)this_00,(ulong)uVar11,0x10);
          if (pcVar7 != (char *)0x0) {
            memset(pcVar7,0,(ulong)uVar11);
          }
        }
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)app_info,"engineName");
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar5);
        memcpy(pcVar7,pCVar6,(ulong)SVar3);
        info->pEngineName = pcVar7;
        this_00 = local_48.s.str;
      }
      __s = (undefined4 *)ScratchAllocator::allocate_raw((ScratchAllocator *)this_00,0xf0,0x10);
      if (__s != (undefined4 *)0x0) {
        memset(__s,0,0xf0);
      }
      *__s = 0x3b9bb078;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pdf_info,"robustBufferAccess");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001458af;
      __s[4] = (pGVar5->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_48.s,(Ch *)pdf_info);
      NVar4.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(pdf_info);
      if (local_48.n.i64 != (Number)NVar4.i64) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pdf_info,"pNext");
        bVar2 = parse_pnext_chain_pdf2((Impl *)this_00,pGVar5,(void **)(__s + 2));
        if (!bVar2) {
          return false;
        }
      }
      HVar8 = Hashing::compute_hash_application_info(info);
      HVar9 = Hashing::compute_hash_physical_device_features(__s);
      uVar12 = (HVar9 & 0xffffffff ^
               ((HVar8 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ HVar8 >> 0x20) *
               0x100000001b3) * 0x100000001b3 ^ HVar9 >> 0x20;
      pp_Var10 = local_38->_vptr_StateCreatorInterface;
      iface = local_38;
      goto LAB_00145897;
    }
  }
  pp_Var10 = iface->_vptr_StateCreatorInterface;
  uVar12 = 0x4d25767f9dce13f5;
  info = (VkApplicationInfo *)0x0;
  __s = (undefined4 *)0x0;
LAB_00145897:
  (*pp_Var10[2])(iface,uVar12,info,__s);
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_application_info(StateCreatorInterface &iface, const Value &app_info, const Value &pdf_info)
{
	if (app_info.HasMember("apiVersion") && pdf_info.HasMember("robustBufferAccess"))
	{
		auto *app = allocator.allocate_cleared<VkApplicationInfo>();
		app->sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
		app->apiVersion = app_info["apiVersion"].GetUint();
		app->applicationVersion = app_info["applicationVersion"].GetUint();
		app->engineVersion = app_info["engineVersion"].GetUint();

		if (app_info.HasMember("applicationName"))
		{
			auto len = app_info["applicationName"].GetStringLength();
			char *name = allocator.allocate_n_cleared<char>(len + 1);
			memcpy(name, app_info["applicationName"].GetString(), len);
			app->pApplicationName = name;
		}

		if (app_info.HasMember("engineName"))
		{
			auto len = app_info["engineName"].GetStringLength();
			char *name = allocator.allocate_n_cleared<char>(len + 1);
			memcpy(name, app_info["engineName"].GetString(), len);
			app->pEngineName = name;
		}

		auto *pdf = allocator.allocate_cleared<VkPhysicalDeviceFeatures2>();
		pdf->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
		pdf->features.robustBufferAccess = pdf_info["robustBufferAccess"].GetUint();

		if (pdf_info.HasMember("pNext"))
			if (!parse_pnext_chain_pdf2(pdf_info["pNext"], &pdf->pNext))
				return false;

		auto hash =
				Hashing::compute_combined_application_feature_hash(
						Hashing::compute_application_feature_hash(app, pdf));
		iface.set_application_info(hash, app, pdf);
	}
	else
	{
		auto hash =
				Hashing::compute_combined_application_feature_hash(
						Hashing::compute_application_feature_hash(nullptr, nullptr));
		iface.set_application_info(hash, nullptr, nullptr);
	}

	return true;
}